

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_rwkv7::llm_build_rwkv7
          (llm_build_rwkv7 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_t sVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *state_mask_00;
  ggml_tensor *pgVar8;
  undefined8 uVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ggml_tensor *pgVar13;
  undefined8 uVar14;
  pointer plVar15;
  ggml_tensor **in_RCX;
  llama_ubatch *in_RDX;
  long in_RSI;
  long in_RDI;
  char *pcVar16;
  ggml_tensor *inp_out_ids;
  ggml_tensor *ffn_norm;
  ggml_tensor *ffn_inp;
  ggml_tensor *x_prev;
  ggml_tensor *att_norm;
  ggml_tensor *ffn_shift;
  ggml_tensor *att_shift;
  ggml_tensor *token_shift;
  llama_layer *layer;
  int il;
  uint32_t n_seqs;
  uint32_t n_seq_tokens;
  uint32_t n_embd;
  ggml_tensor *state_mask;
  ggml_tensor *state_copy;
  ggml_tensor *v_first;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  ggml_tensor *in_stack_fffffffffffffd18;
  int iVar17;
  llm_graph_context *in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  ggml_tensor *in_stack_fffffffffffffd30;
  ggml_tensor *in_stack_fffffffffffffd38;
  llm_graph_context *in_stack_fffffffffffffd40;
  ggml_tensor *in_stack_fffffffffffffd50;
  llm_arch arch;
  ggml_tensor *in_stack_fffffffffffffd58;
  ggml_tensor *in_stack_fffffffffffffd60;
  llama_layer *in_stack_fffffffffffffd68;
  ggml_tensor *in_stack_fffffffffffffd70;
  ggml_tensor *in_stack_fffffffffffffd78;
  ggml_tensor *in_stack_fffffffffffffd80;
  ggml_cgraph *in_stack_fffffffffffffd88;
  llm_graph_context *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffe28;
  llm_graph_context *in_stack_fffffffffffffe30;
  undefined8 local_a0;
  int local_68;
  ggml_tensor *x_prev_00;
  ggml_tensor *in_stack_ffffffffffffffc8;
  llm_build_rwkv7_base *in_stack_ffffffffffffffd0;
  ggml_tensor **ppgVar18;
  
  llm_build_rwkv7_base::llm_build_rwkv7_base
            ((llm_build_rwkv7_base *)in_stack_fffffffffffffd30,
             (llama_model *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
             (llm_graph_params *)in_stack_fffffffffffffd20);
  if (*(int *)(*(long *)(in_RDI + 8) + 0x1898) != 2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2e9f,"GGML_ASSERT(%s) failed","hparams.token_shift_count == 2");
  }
  x_prev_00 = (ggml_tensor *)0x0;
  llm_graph_context::build_inp_embd(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  pgVar6 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                      (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                      (llm_norm_type)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                      (int)in_stack_fffffffffffffd20);
  pgVar7 = llm_graph_context::build_inp_s_copy((llm_graph_context *)in_stack_fffffffffffffd80);
  state_mask_00 =
       llm_graph_context::build_inp_s_mask((llm_graph_context *)in_stack_fffffffffffffd80);
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 8);
  iVar2 = *(int *)(*(long *)(in_RDI + 0x18) + 8);
  uVar3 = *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0xc);
  for (local_68 = 0; arch = (llm_arch)((ulong)in_stack_fffffffffffffd50 >> 0x20),
      iVar17 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
      (long)local_68 < *(long *)(in_RDI + 0x28); local_68 = local_68 + 1) {
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_68
              );
    pgVar6 = (ggml_tensor *)ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar6,uVar1,iVar2,uVar3)
    ;
    pgVar8 = llm_graph_context::build_rwkv_token_shift_load
                       (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                        in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                        (llama_ubatch *)in_stack_fffffffffffffd70,
                        (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    uVar9 = ggml_view_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar8,uVar1,1,uVar3,pgVar8->nb[1],
                         pgVar8->nb[2],0);
    uVar14 = *(undefined8 *)(in_RDI + 0xc0);
    sVar4 = pgVar8->nb[1];
    iVar17 = (int)(pgVar8->nb[2] >> 0x20);
    lVar10 = ggml_element_size();
    pcVar16 = (char *)((ulong)uVar1 * lVar10);
    uVar11 = ggml_view_3d(uVar14,pgVar8,(ulong)uVar1,1,uVar3,sVar4);
    pgVar8 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                        in_stack_fffffffffffffd30,
                        (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                        ,(llm_norm_type)((ulong)pcVar16 >> 0x20),(int)pcVar16);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),pcVar16,
               iVar17);
    uVar14 = *(undefined8 *)(in_RDI + 0xc0);
    uVar12 = ggml_view_3d(uVar14,pgVar8,uVar1,iVar2 + -1,uVar3,pgVar8->nb[1],pgVar8->nb[2],0);
    ggml_concat(uVar14,uVar9,uVar12,1);
    pcVar16 = *(char **)(in_RDI + 0x18);
    iVar17 = (int)((ulong)&stack0xffffffffffffffb8 >> 0x20);
    in_stack_fffffffffffffd28 = local_68;
    pgVar13 = llm_build_rwkv7_base::build_rwkv7_time_mix
                        (in_stack_ffffffffffffffd0,(ggml_cgraph *)in_stack_ffffffffffffffc8,pgVar6,
                         x_prev_00,pgVar7,state_mask_00,in_RCX,in_RDX,(int)in_RSI);
    local_a0 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar13,pgVar6);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),pcVar16,
               iVar17);
    pgVar6 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                        in_stack_fffffffffffffd30,
                        (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                        ,(llm_norm_type)((ulong)pcVar16 >> 0x20),(int)pcVar16);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),pcVar16,
               iVar17);
    uVar14 = *(undefined8 *)(in_RDI + 0xc0);
    uVar9 = ggml_view_3d(uVar14,pgVar6,uVar1,iVar2 + -1,uVar3,pgVar6->nb[1],pgVar6->nb[2],0);
    uVar11 = ggml_concat(uVar14,uVar11,uVar9,1);
    uVar14 = *(undefined8 *)(in_RDI + 0xc0);
    sVar4 = pgVar8->nb[1];
    sVar5 = pgVar8->nb[2];
    uVar9 = uVar14;
    lVar10 = ggml_element_size();
    uVar12 = ggml_view_3d(uVar14,pgVar8,uVar1,1,uVar3,sVar4,sVar5,
                          (ulong)((iVar2 + -1) * uVar1) * lVar10);
    uVar14 = *(undefined8 *)(in_RDI + 0xc0);
    sVar4 = pgVar6->nb[1];
    in_stack_fffffffffffffd18 = (ggml_tensor *)pgVar6->nb[2];
    lVar10 = ggml_element_size();
    in_stack_fffffffffffffd20 = (llm_graph_context *)((ulong)((iVar2 + -1) * uVar1) * lVar10);
    uVar14 = ggml_view_3d(uVar14,pgVar6,uVar1,1,uVar3,sVar4);
    ggml_concat(uVar9,uVar12,uVar14,1);
    ppgVar18 = in_RCX;
    pgVar8 = llm_graph_context::build_rwkv_token_shift_store
                       ((llm_graph_context *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                        (llama_ubatch *)in_stack_fffffffffffffd70,
                        (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    ggml_build_forward_expand(in_RCX,pgVar8);
    in_RCX = ppgVar18;
    if ((long)local_68 == *(long *)(in_RDI + 0x28) + -1) {
      pgVar8 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffd70);
      uVar14 = *(undefined8 *)(in_RDI + 0xc0);
      uVar9 = ggml_reshape_2d(uVar14,local_a0,uVar1,(long)*(int *)(in_RDI + 0xa8));
      local_a0 = ggml_get_rows(uVar14,uVar9,pgVar8);
      in_stack_fffffffffffffd88 = *(ggml_cgraph **)(in_RDI + 0xc0);
      in_stack_fffffffffffffd90 =
           (llm_graph_context *)
           ggml_reshape_2d(in_stack_fffffffffffffd88,pgVar6,uVar1,(long)*(int *)(in_RDI + 0xa8));
      in_stack_fffffffffffffd80 =
           (ggml_tensor *)ggml_get_rows(in_stack_fffffffffffffd88,in_stack_fffffffffffffd90,pgVar8);
      in_stack_fffffffffffffd70 = *(ggml_tensor **)(in_RDI + 0xc0);
      in_stack_fffffffffffffd78 =
           (ggml_tensor *)
           ggml_reshape_2d(in_stack_fffffffffffffd70,uVar11,uVar1,(long)*(int *)(in_RDI + 0xa8));
      in_stack_fffffffffffffd68 =
           (llama_layer *)ggml_get_rows(in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,pgVar8);
      in_RCX = ppgVar18;
    }
    in_stack_fffffffffffffd60 =
         llm_build_rwkv7_base::build_rwkv7_channel_mix
                   ((llm_build_rwkv7_base *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                    in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,arch);
    in_stack_fffffffffffffd58 =
         (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),in_stack_fffffffffffffd60,local_a0);
    in_stack_fffffffffffffd50 =
         llm_graph_context::build_cvec(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0);
    pgVar6 = in_stack_fffffffffffffd50;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd30,
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
               (char *)in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    in_stack_ffffffffffffffc8 = pgVar6;
  }
  pgVar6 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                      (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                      (llm_norm_type)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                      (int)in_stack_fffffffffffffd20);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd30,
             (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
             (char *)in_stack_fffffffffffffd20,iVar17);
  plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4fbe28);
  plVar15->t_embd = pgVar6;
  pgVar7 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      in_stack_fffffffffffffd70);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd30,
             (ggml_tensor *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
             (char *)in_stack_fffffffffffffd20,iVar17);
  pgVar6 = pgVar7;
  plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4fbead);
  plVar15->t_logits = pgVar7;
  ggml_build_forward_expand(in_RCX,pgVar6);
  return;
}

Assistant:

llm_build_rwkv7(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_build_rwkv7_base(model, params) {
        GGML_ASSERT(hparams.token_shift_count == 2);

        ggml_tensor * cur;
        ggml_tensor * inpL;
        ggml_tensor * v_first = nullptr;

        inpL = build_inp_embd(model.tok_embd);
        inpL = build_norm(inpL, model.tok_norm, model.tok_norm_b, LLM_NORM, -1);

        ggml_tensor * state_copy = build_inp_s_copy();
        ggml_tensor * state_mask = build_inp_s_mask();

        const auto n_embd = hparams.n_embd;
        const auto n_seq_tokens = ubatch.n_seq_tokens;
        const auto n_seqs = ubatch.n_seqs;

        for (int il = 0; il < n_layer; ++il) {
            const llama_layer * layer = &model.layers[il];
            inpL = ggml_reshape_3d(ctx0, inpL, n_embd, n_seq_tokens, n_seqs);

            ggml_tensor * token_shift = build_rwkv_token_shift_load(
                    gf, state_copy, state_mask, ubatch, il
                    );

            ggml_tensor * att_shift = ggml_view_3d(ctx0, token_shift, n_embd, 1, n_seqs, token_shift->nb[1], token_shift->nb[2], 0);
            ggml_tensor * ffn_shift = ggml_view_3d(ctx0, token_shift, n_embd, 1, n_seqs, token_shift->nb[1], token_shift->nb[2], n_embd * ggml_element_size(token_shift));

            ggml_tensor * att_norm = build_norm(inpL, layer->attn_norm, layer->attn_norm_b, LLM_NORM, il);
            cb(att_norm, "attn_norm", il);

            ggml_tensor * x_prev = ggml_concat(
                    ctx0,
                    att_shift,
                    ggml_view_3d(ctx0, att_norm, n_embd, n_seq_tokens - 1, n_seqs, att_norm->nb[1], att_norm->nb[2], 0),
                    1
                    );

            cur = build_rwkv7_time_mix(gf, att_norm, x_prev, state_copy, state_mask, v_first, ubatch, il);

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            ggml_tensor * ffn_norm = build_norm(ffn_inp, layer->attn_norm_2, layer->attn_norm_2_b, LLM_NORM, il);
            cb(ffn_norm, "ffn_norm", il);

            x_prev = ggml_concat(
                    ctx0,
                    ffn_shift,
                    ggml_view_3d(ctx0, ffn_norm, n_embd, n_seq_tokens - 1, n_seqs, ffn_norm->nb[1], ffn_norm->nb[2], 0),
                    1
                    );

            token_shift = ggml_concat(ctx0,
                    ggml_view_3d(ctx0, att_norm, n_embd, 1, n_seqs, att_norm->nb[1], att_norm->nb[2], (n_seq_tokens-1)*n_embd*ggml_element_size(att_norm)),
                    ggml_view_3d(ctx0, ffn_norm, n_embd, 1, n_seqs, ffn_norm->nb[1], ffn_norm->nb[2], (n_seq_tokens-1)*n_embd*ggml_element_size(ffn_norm)),
                    1
                    );
            ggml_build_forward_expand(gf, build_rwkv_token_shift_store(token_shift, ubatch, il));

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                struct ggml_tensor * inp_out_ids = build_inp_out_ids();
                ffn_inp  = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, ffn_inp,  n_embd, n_tokens), inp_out_ids);
                ffn_norm = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, ffn_norm, n_embd, n_tokens), inp_out_ids);
                x_prev   = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, x_prev,   n_embd, n_tokens), inp_out_ids);
            }

            cur = build_rwkv7_channel_mix(layer, ffn_norm, x_prev, LLM_ARCH_RWKV7);
            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;
        cur = build_norm(cur, model.output_norm, model.output_norm_b, LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }